

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O1

int __thiscall
QTextMarkdownImporter::cbLeaveSpan(QTextMarkdownImporter *this,int spanType,void *detail)

{
  char *pcVar1;
  QDebug QVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  char *pcVar6;
  undefined8 *puVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  undefined1 local_b8 [16];
  long local_a8;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined4 local_84;
  char *local_80;
  QDebug local_78;
  QString local_70;
  QFont local_58;
  QTextFormat local_48;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_38);
  if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
    QList<QTextCharFormat>::takeLast((QList<QTextCharFormat> *)&local_48);
    QTextFormat::~QTextFormat(&local_48);
    if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
      iVar5 = QList<QTextCharFormat>::end(&(this->m_spanFormatStack).super_QList<QTextCharFormat>);
      QTextFormat::operator=((QTextFormat *)local_38,&iVar5.i[-1].super_QTextFormat);
    }
  }
  QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)local_38);
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_98 = 2;
    local_94 = 0;
    uStack_8c = 0;
    local_84 = 0;
    local_80 = lcMD::category.name;
    QMessageLogger::debug();
    QTextStream::operator<<(&(local_78.stream)->ts,spanType);
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    QVar2.stream = local_78.stream;
    QVar9.m_data = (storage_type *)0xd;
    QVar9.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(&(QVar2.stream)->ts,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    QTextCharFormat::font((QTextCharFormat *)&local_58);
    QFont::families((QStringList *)(local_b8 + 8),&local_58);
    puVar7 = *(undefined8 **)(local_a8 + 8);
    if (puVar7 == (undefined8 *)0x0) {
      puVar7 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_78,(ulong)puVar7);
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    bVar3 = QTextFormat::hasProperty((QTextFormat *)local_38,0x2003);
    iVar4 = 400;
    if (bVar3) {
      iVar4 = QTextFormat::intProperty((QTextFormat *)local_38,0x2003);
    }
    QTextStream::operator<<(&(local_78.stream)->ts,iVar4);
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    bVar3 = QTextFormat::boolProperty((QTextFormat *)local_38,0x2004);
    QVar2.stream = local_78.stream;
    pcVar6 = "";
    if (bVar3) {
      pcVar6 = "italic";
    }
    psVar8 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar8 + (long)(pcVar6 + 1);
      psVar8 = psVar8 + 1;
    } while (*pcVar1 != '\0');
    QVar10.m_data = psVar8;
    QVar10.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(&(QVar2.stream)->ts,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    QTextFormat::brushProperty((QTextFormat *)local_b8,(int)local_38);
    QColor::name(&local_70,(QColor *)(local_b8._0_8_ + 8),HexRgb);
    if (local_70.d.ptr == (char16_t *)0x0) {
      local_70.d.ptr = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_78,(ulong)local_70.d.ptr);
    if ((local_78.stream)->space == true) {
      QTextStream::operator<<(&(local_78.stream)->ts,' ');
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    QBrush::~QBrush((QBrush *)local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_b8 + 8));
    QFont::~QFont(&local_58);
    QDebug::~QDebug(&local_78);
  }
  if (spanType == 3) {
    this->m_imageSpan = false;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTextMarkdownImporter::cbLeaveSpan(int spanType, void *detail)
{
    Q_UNUSED(detail);
    QTextCharFormat charFmt;
    if (!m_spanFormatStack.isEmpty()) {
        m_spanFormatStack.pop();
        if (!m_spanFormatStack.isEmpty())
            charFmt = m_spanFormatStack.top();
    }
    m_cursor.setCharFormat(charFmt);
    qCDebug(lcMD) << spanType << "setCharFormat" << charFmt.font().families().constFirst()
                  << charFmt.fontWeight() << (charFmt.fontItalic() ? "italic" : "")
                  << charFmt.foreground().color().name();
    if (spanType == int(MD_SPAN_IMG))
        m_imageSpan = false;
    return 0; // no error
}